

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compression.cpp
# Opt level: O0

bool withinB44ErrorBounds(uint16_t (*A) [4],uint16_t (*B) [4])

{
  ushort h;
  ushort h_00;
  short sVar1;
  int iVar2;
  ostream *poVar3;
  byte bVar4;
  long in_RSI;
  long in_RDI;
  float fVar5;
  uint16_t Abits_1;
  uint16_t Bbits;
  uint16_t A1bits;
  int i_5;
  int bias;
  uint16_t A1 [16];
  int i_4;
  int bias_1;
  int i_3;
  int rMax;
  int rMin;
  int r [15];
  int d [16];
  int shift;
  int i_2;
  uint16_t tMax;
  uint16_t Abits;
  int i_1;
  uint16_t t [16];
  int j;
  int i;
  bool equal;
  bool local_139;
  ushort local_124;
  int local_120;
  ushort local_118 [22];
  int local_ec;
  undefined4 local_e8;
  int local_e4;
  int local_e0;
  int local_dc;
  int local_d8 [16];
  int local_98 [4];
  int local_88;
  int local_84;
  int local_80;
  int local_7c;
  int local_78;
  int local_74;
  int local_70;
  int local_6c;
  int local_68;
  int local_64;
  int local_60;
  int local_5c;
  int local_58;
  int local_54;
  ushort local_50;
  ushort local_4e;
  int local_4c;
  ushort local_48 [18];
  int local_24;
  int local_20;
  char local_19;
  long local_18;
  long local_10;
  
  local_19 = '\x01';
  for (local_20 = 0; local_20 < 4; local_20 = local_20 + 1) {
    for (local_24 = 0; local_24 < 4; local_24 = local_24 + 1) {
      if (*(short *)(in_RDI + (long)local_20 * 8 + (long)local_24 * 2) !=
          *(short *)(in_RSI + (long)local_20 * 8 + (long)local_24 * 2)) {
        local_19 = '\0';
      }
    }
  }
  if (local_19 == '\0') {
    for (local_4c = 0; local_4c < 0x10; local_4c = local_4c + 1) {
      local_4e = *(ushort *)(in_RDI + (long)(local_4c / 4) * 8 + (long)(local_4c % 4) * 2);
      if ((local_4e & 0x7c00) == 0x7c00) {
        local_48[local_4c] = 0x8000;
      }
      else if ((local_4e & 0x8000) == 0) {
        local_48[local_4c] = local_4e | 0x8000;
      }
      else {
        local_48[local_4c] = local_4e ^ 0xffff;
      }
    }
    local_50 = 0;
    for (local_54 = 0; local_54 < 0x10; local_54 = local_54 + 1) {
      if (local_50 < local_48[local_54]) {
        local_50 = local_48[local_54];
      }
    }
    local_58 = -1;
    local_18 = in_RSI;
    local_10 = in_RDI;
    do {
      local_58 = local_58 + 1;
      for (local_e4 = 0; local_e4 < 0x10; local_e4 = local_e4 + 1) {
        iVar2 = shiftAndRound((uint)local_50 - (uint)local_48[local_e4],local_58);
        local_98[local_e4] = iVar2;
      }
      local_e8 = 0x20;
      local_d8[0] = (local_98[0] - local_88) + 0x20;
      local_d8[1] = (local_88 - local_78) + 0x20;
      local_d8[2] = (local_78 - local_68) + 0x20;
      local_d8[3] = (local_98[0] - local_98[1]) + 0x20;
      local_d8[4] = (local_88 - local_84) + 0x20;
      local_d8[5] = (local_78 - local_74) + 0x20;
      local_d8[6] = (local_68 - local_64) + 0x20;
      local_d8[7] = (local_98[1] - local_98[2]) + 0x20;
      local_d8[8] = (local_84 - local_80) + 0x20;
      local_d8[9] = (local_74 - local_70) + 0x20;
      local_d8[10] = (local_64 - local_60) + 0x20;
      local_d8[0xb] = (local_98[2] - local_98[3]) + 0x20;
      local_d8[0xc] = (local_80 - local_7c) + 0x20;
      local_d8[0xd] = (local_70 - local_6c) + 0x20;
      local_d8[0xe] = (local_60 - local_5c) + 0x20;
      local_e0 = local_d8[0];
      local_dc = local_d8[0];
      for (local_ec = 1; local_ec < 0xf; local_ec = local_ec + 1) {
        if (local_d8[local_ec] < local_dc) {
          local_dc = local_d8[local_ec];
        }
        if (local_e0 < local_d8[local_ec]) {
          local_e0 = local_d8[local_ec];
        }
      }
      local_139 = local_dc < 0 || 0x3f < local_e0;
    } while (local_139);
    bVar4 = (byte)local_58;
    local_48[0] = local_50 - (short)(local_98[0] << (bVar4 & 0x1f));
    local_118[0] = local_48[0];
    sVar1 = (short)(0x20 << (bVar4 & 0x1f));
    local_118[4] = (local_48[0] + (short)(local_d8[0] << (bVar4 & 0x1f))) - sVar1;
    local_118[8] = (local_118[4] + (short)(local_d8[1] << (bVar4 & 0x1f))) - sVar1;
    local_118[0xc] = (local_118[8] + (short)(local_d8[2] << (bVar4 & 0x1f))) - sVar1;
    local_118[1] = (local_48[0] + (short)(local_d8[3] << (bVar4 & 0x1f))) - sVar1;
    local_118[5] = (local_118[4] + (short)(local_d8[4] << (bVar4 & 0x1f))) - sVar1;
    local_118[9] = (local_118[8] + (short)(local_d8[5] << (bVar4 & 0x1f))) - sVar1;
    local_118[0xd] = (local_118[0xc] + (short)(local_d8[6] << (bVar4 & 0x1f))) - sVar1;
    local_118[2] = (local_118[1] + (short)(local_d8[7] << (bVar4 & 0x1f))) - sVar1;
    local_118[6] = (local_118[5] + (short)(local_d8[8] << (bVar4 & 0x1f))) - sVar1;
    local_118[10] = (local_118[9] + (short)(local_d8[9] << (bVar4 & 0x1f))) - sVar1;
    local_118[0xe] = (local_118[0xd] + (short)(local_d8[10] << (bVar4 & 0x1f))) - sVar1;
    local_118[3] = (local_118[2] + (short)(local_d8[0xb] << (bVar4 & 0x1f))) - sVar1;
    local_118[7] = (local_118[6] + (short)(local_d8[0xc] << (bVar4 & 0x1f))) - sVar1;
    local_118[0xb] = (local_118[10] + (short)(local_d8[0xd] << (bVar4 & 0x1f))) - sVar1;
    local_118[0xf] = (local_118[0xe] + (short)(local_d8[0xe] << (bVar4 & 0x1f))) - sVar1;
    for (local_120 = 0; local_120 < 0x10; local_120 = local_120 + 1) {
      h = local_118[local_120];
      local_124 = *(ushort *)(local_18 + (long)(local_120 / 4) * 8 + (long)(local_120 % 4) * 2);
      h_00 = *(ushort *)(local_10 + (long)(local_120 / 4) * 8 + (long)(local_120 % 4) * 2);
      if ((local_124 & 0x8000) == 0) {
        local_124 = local_124 | 0x8000;
      }
      else {
        local_124 = local_124 ^ 0xffff;
      }
      if ((h + 5 < (uint)local_124) || ((int)(uint)local_124 < (int)(h - 5))) {
        poVar3 = std::operator<<((ostream *)&std::cerr,"B44 idx ");
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_120);
        poVar3 = std::operator<<(poVar3,": B bits ");
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,std::hex);
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_124);
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,std::dec);
        poVar3 = std::operator<<(poVar3," (");
        fVar5 = imath_half_to_float(local_124);
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,fVar5);
        poVar3 = std::operator<<(poVar3,") too different from A1 bits ");
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,std::hex);
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,h);
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,std::dec);
        poVar3 = std::operator<<(poVar3," (");
        fVar5 = imath_half_to_float(h);
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,fVar5);
        poVar3 = std::operator<<(poVar3,")");
        poVar3 = std::operator<<(poVar3," orig ");
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,std::hex);
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,h_00);
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,std::dec);
        poVar3 = std::operator<<(poVar3," (");
        fVar5 = imath_half_to_float(h_00);
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,fVar5);
        poVar3 = std::operator<<(poVar3,")");
        std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
        return false;
      }
    }
  }
  return true;
}

Assistant:

inline bool
withinB44ErrorBounds (const uint16_t A[4][4], const uint16_t B[4][4])
{
    //
    // Assuming that a 4x4 pixel block, B, was generated by
    // compressing and uncompressing another pixel block, A,
    // using OpenEXR's B44 compression method, check whether
    // the differences between A and B are what we would
    // expect from the compressor.
    //

    //
    // The block may not have been compressed at all if it
    // was part of a very small tile.
    //

    bool equal = true;

    for (int i = 0; i < 4; ++i)
        for (int j = 0; j < 4; ++j)
            if (A[i][j] != B[i][j]) equal = false;

    if (equal) return true;

    //
    // The block was compressed.
    //
    // Perform a "light" version of the B44 compression on A
    // (see the pack() function in ImfB44Compressor.cpp).
    //

    uint16_t t[16];

    for (int i = 0; i < 16; ++i)
    {
        uint16_t Abits = A[i / 4][i % 4];

        if ((Abits & 0x7c00) == 0x7c00)
            t[i] = 0x8000;
        else if (Abits & 0x8000)
            t[i] = ~Abits;
        else
            t[i] = Abits | 0x8000;
    }

    uint16_t tMax = 0;

    for (int i = 0; i < 16; ++i)
        if (tMax < t[i]) tMax = t[i];

    int shift = -1;
    int d[16];
    int r[15];
    int rMin;
    int rMax;

    do
    {
        shift += 1;

        for (int i = 0; i < 16; ++i)
            d[i] = shiftAndRound (tMax - t[i], shift);

        const int bias = 0x20;

        r[0] = d[0] - d[4] + bias;
        r[1] = d[4] - d[8] + bias;
        r[2] = d[8] - d[12] + bias;

        r[3] = d[0] - d[1] + bias;
        r[4] = d[4] - d[5] + bias;
        r[5] = d[8] - d[9] + bias;
        r[6] = d[12] - d[13] + bias;

        r[7]  = d[1] - d[2] + bias;
        r[8]  = d[5] - d[6] + bias;
        r[9]  = d[9] - d[10] + bias;
        r[10] = d[13] - d[14] + bias;

        r[11] = d[2] - d[3] + bias;
        r[12] = d[6] - d[7] + bias;
        r[13] = d[10] - d[11] + bias;
        r[14] = d[14] - d[15] + bias;

        rMin = r[0];
        rMax = r[0];

        for (int i = 1; i < 15; ++i)
        {
            if (rMin > r[i]) rMin = r[i];

            if (rMax < r[i]) rMax = r[i];
        }
    } while (rMin < 0 || rMax > 0x3f);

    t[0] = tMax - (d[0] << shift);

    //
    // Now perform a "light" version of the decompression method.
    // (see the unpack() function in ImfB44Compressor.cpp).
    //

    uint16_t  A1[16];
    const int bias = 0x20 << shift;

    A1[0]  = t[0];
    A1[4]  = A1[0] + (r[0] << shift) - bias;
    A1[8]  = A1[4] + (r[1] << shift) - bias;
    A1[12] = A1[8] + (r[2] << shift) - bias;

    A1[1]  = A1[0] + (r[3] << shift) - bias;
    A1[5]  = A1[4] + (r[4] << shift) - bias;
    A1[9]  = A1[8] + (r[5] << shift) - bias;
    A1[13] = A1[12] + (r[6] << shift) - bias;

    A1[2]  = A1[1] + (r[7] << shift) - bias;
    A1[6]  = A1[5] + (r[8] << shift) - bias;
    A1[10] = A1[9] + (r[9] << shift) - bias;
    A1[14] = A1[13] + (r[10] << shift) - bias;

    A1[3]  = A1[2] + (r[11] << shift) - bias;
    A1[7]  = A1[6] + (r[12] << shift) - bias;
    A1[11] = A1[10] + (r[13] << shift) - bias;
    A1[15] = A1[14] + (r[14] << shift) - bias;

    //
    // Compare the result with B, allowing for an difference
    // of a couple of units in the last place.
    //

    for (int i = 0; i < 16; ++i)
    {
        uint16_t A1bits = A1[i];
        uint16_t Bbits  = B[i / 4][i % 4];
        uint16_t Abits  = A[i / 4][i % 4];

        if (Bbits & 0x8000)
            Bbits = ~Bbits;
        else
            Bbits = Bbits | 0x8000;

        if (Bbits > A1bits + 5 || Bbits < A1bits - 5)
        {
            std::cerr << "B44 idx " << i << ": B bits " << std::hex << Bbits
                      << std::dec << " (" << imath_half_to_float (Bbits)
                      << ") too different from A1 bits " << std::hex << A1bits
                      << std::dec << " (" << imath_half_to_float (A1bits) << ")"
                      << " orig " << std::hex << Abits << std::dec << " ("
                      << imath_half_to_float (Abits) << ")" << std::endl;
            return false;
        }
    }

    return true;
}